

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedExecution.h
# Opt level: O0

void nrg::TimedExecution::push<TimedCaller>(Queue *queue,TimedCaller *fn)

{
  QueueElement local_68;
  undefined1 local_40 [8];
  QueueElement elem;
  TimedCaller *fn_local;
  Queue *queue_local;
  
  elem.what._M_invoker = (_Invoker_type)fn;
  local_40 = (undefined1  [8])now();
  std::function<void()>::function<TimedCaller,void>((function<void()> *)&elem,fn);
  QueueElement::QueueElement(&local_68,(QueueElement *)local_40);
  push(queue,&local_68);
  QueueElement::~QueueElement(&local_68);
  QueueElement::~QueueElement((QueueElement *)local_40);
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { now(), std::move(fn) };
        push(queue, std::move(elem));
    }